

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3EvalAllocateReaders(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pnToken,int *pnOr,int *pRc)

{
  int iVar1;
  int nTerm;
  int isPrefix;
  int iVar2;
  Fts3Phrase *pFVar3;
  char *zTerm;
  Fts3Table *p;
  int iVar4;
  Fts3MultiSegReader *pCsr_00;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  while( true ) {
    if (pExpr == (Fts3Expr *)0x0) {
      return;
    }
    if (*pRc != 0) {
      return;
    }
    if (pExpr->eType == 5) break;
    *pnOr = *pnOr + (uint)(pExpr->eType == 4);
    fts3EvalAllocateReaders(pCsr,pExpr->pLeft,pnToken,pnOr,pRc);
    pExpr = pExpr->pRight;
  }
  iVar1 = pExpr->pPhrase->nToken;
  *pnToken = *pnToken + iVar1;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    do {
      pFVar3 = pExpr->pPhrase;
      zTerm = pFVar3->aToken[lVar5].z;
      nTerm = pFVar3->aToken[lVar5].n;
      isPrefix = pFVar3->aToken[lVar5].isPrefix;
      iVar4 = sqlite3_initialize();
      if (iVar4 == 0) {
        pCsr_00 = (Fts3MultiSegReader *)sqlite3Malloc(0x58);
      }
      else {
        pCsr_00 = (Fts3MultiSegReader *)0x0;
      }
      if (pCsr_00 == (Fts3MultiSegReader *)0x0) {
        iVar4 = 7;
      }
      else {
        p = (Fts3Table *)(pCsr->base).pVtab;
        if (isPrefix == 0) {
          iVar4 = 7;
          bVar8 = true;
        }
        else {
          if (p->nIndex < 2) {
            iVar4 = 7;
            bVar8 = true;
          }
          else {
            lVar6 = 1;
            iVar4 = 7;
            lVar7 = 0x28;
            do {
              bVar8 = *(int *)((long)&p->aIndex->nPrefix + lVar7) != nTerm;
              if (!bVar8) {
                iVar4 = pCsr->iLangid;
                *(undefined8 *)&pCsr_00->nTerm = 0;
                pCsr_00->aDoclist = (char *)0x0;
                *(undefined8 *)&pCsr_00->bLookup = 0;
                pCsr_00->zTerm = (char *)0x0;
                pCsr_00->nBuffer = 0;
                pCsr_00->iColFilter = 0;
                pCsr_00->bRestart = 0;
                pCsr_00->nCost = 0;
                pCsr_00->pFilter = (Fts3SegFilter *)0x0;
                pCsr_00->aBuffer = (char *)0x0;
                pCsr_00->apSegment = (Fts3SegReader **)0x0;
                pCsr_00->nSegment = 0;
                pCsr_00->nAdvance = 0;
                *(undefined8 *)&pCsr_00->nDoclist = 0;
                iVar4 = fts3SegReaderCursor(p,iVar4,(int)lVar6,-2,zTerm,nTerm,0,0,pCsr_00);
                pCsr_00->bLookup = 1;
                break;
              }
              lVar6 = lVar6 + 1;
              lVar7 = lVar7 + 0x28;
            } while (lVar6 < p->nIndex);
          }
          if (bVar8) {
            lVar7 = 1;
            lVar6 = 0x28;
            do {
              bVar8 = p->nIndex <= lVar7;
              if (p->nIndex <= lVar7) goto LAB_001bd476;
              iVar2 = *(int *)((long)&p->aIndex->nPrefix + lVar6);
              if (iVar2 == nTerm + 1) {
                iVar4 = pCsr->iLangid;
                *(undefined8 *)&pCsr_00->nTerm = 0;
                pCsr_00->aDoclist = (char *)0x0;
                *(undefined8 *)&pCsr_00->bLookup = 0;
                pCsr_00->zTerm = (char *)0x0;
                pCsr_00->nBuffer = 0;
                pCsr_00->iColFilter = 0;
                pCsr_00->bRestart = 0;
                pCsr_00->nCost = 0;
                pCsr_00->pFilter = (Fts3SegFilter *)0x0;
                pCsr_00->aBuffer = (char *)0x0;
                pCsr_00->apSegment = (Fts3SegReader **)0x0;
                pCsr_00->nSegment = 0;
                pCsr_00->nAdvance = 0;
                *(undefined8 *)&pCsr_00->nDoclist = 0;
                iVar4 = fts3SegReaderCursor(p,iVar4,(int)lVar7,-2,zTerm,nTerm,1,0,pCsr_00);
                if (iVar4 == 0) {
                  iVar4 = fts3SegReaderCursor(p,pCsr->iLangid,0,-2,zTerm,nTerm,0,0,pCsr_00);
                }
              }
              lVar7 = lVar7 + 1;
              lVar6 = lVar6 + 0x28;
            } while (iVar2 != nTerm + 1);
          }
          bVar8 = false;
        }
LAB_001bd476:
        if (bVar8) {
          iVar4 = pCsr->iLangid;
          *(undefined8 *)&pCsr_00->nTerm = 0;
          pCsr_00->aDoclist = (char *)0x0;
          *(undefined8 *)&pCsr_00->bLookup = 0;
          pCsr_00->zTerm = (char *)0x0;
          pCsr_00->nBuffer = 0;
          pCsr_00->iColFilter = 0;
          pCsr_00->bRestart = 0;
          pCsr_00->nCost = 0;
          pCsr_00->pFilter = (Fts3SegFilter *)0x0;
          pCsr_00->aBuffer = (char *)0x0;
          pCsr_00->apSegment = (Fts3SegReader **)0x0;
          pCsr_00->nSegment = 0;
          pCsr_00->nAdvance = 0;
          *(undefined8 *)&pCsr_00->nDoclist = 0;
          iVar4 = fts3SegReaderCursor(p,iVar4,0,-2,zTerm,nTerm,isPrefix,0,pCsr_00);
          pCsr_00->bLookup = (uint)(isPrefix == 0);
        }
      }
      pFVar3->aToken[lVar5].pSegcsr = pCsr_00;
      if (iVar4 != 0) {
        *pRc = iVar4;
        return;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  pExpr->pPhrase->iDoclistToken = -1;
  return;
}

Assistant:

static void fts3EvalAllocateReaders(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Allocate readers for this expression */
  int *pnToken,                   /* OUT: Total number of tokens in phrase. */
  int *pnOr,                      /* OUT: Total number of OR nodes in expr. */
  int *pRc                        /* IN/OUT: Error code */
){
  if( pExpr && SQLITE_OK==*pRc ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      int i;
      int nToken = pExpr->pPhrase->nToken;
      *pnToken += nToken;
      for(i=0; i<nToken; i++){
        Fts3PhraseToken *pToken = &pExpr->pPhrase->aToken[i];
        int rc = fts3TermSegReaderCursor(pCsr, 
            pToken->z, pToken->n, pToken->isPrefix, &pToken->pSegcsr
        );
        if( rc!=SQLITE_OK ){
          *pRc = rc;
          return;
        }
      }
      assert( pExpr->pPhrase->iDoclistToken==0 );
      pExpr->pPhrase->iDoclistToken = -1;
    }else{
      *pnOr += (pExpr->eType==FTSQUERY_OR);
      fts3EvalAllocateReaders(pCsr, pExpr->pLeft, pnToken, pnOr, pRc);
      fts3EvalAllocateReaders(pCsr, pExpr->pRight, pnToken, pnOr, pRc);
    }
  }
}